

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

void TestSuite::spawnThread(ThreadInternalArgs *args)

{
  int iVar1;
  
  iVar1 = std::function<int_(TestSuite::ThreadArgs_*)>::operator()(&args->func,args->userArgs);
  args->rc = iVar1;
  return;
}

Assistant:

static void spawnThread(ThreadInternalArgs* args) {
        args->rc = args->func(args->userArgs);
    }